

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBuffer.c
# Opt level: O0

float Abc_BufComputeDep(Buf_Man_t *p,Abc_Obj_t *pObj)

{
  Vec_Int_t *p_00;
  int iVar1;
  uint i_00;
  int iVar2;
  Abc_Obj_t *pObj_00;
  float local_2c;
  float Delay;
  float DelayF;
  int i;
  Abc_Obj_t *pFanout;
  Abc_Obj_t *pObj_local;
  Buf_Man_t *p_local;
  
  local_2c = -1e+09;
  for (Delay = 0.0; iVar1 = Abc_ObjFanoutNum(pObj), (int)Delay < iVar1;
      Delay = (float)((int)Delay + 1)) {
    pObj_00 = Abc_ObjFanout(pObj,(int)Delay);
    p_00 = p->vOffsets;
    i_00 = Abc_ObjId(pObj_00);
    iVar1 = Vec_IntEntry(p_00,i_00);
    if (iVar1 != -1000000000) {
      iVar1 = Abc_BufNodeDep(p,pObj_00);
      iVar2 = Abc_NodeFindFanin(pObj_00,pObj);
      iVar2 = Abc_BufEdgeDelay(p,pObj_00,iVar2);
      if (local_2c < (float)(iVar1 + iVar2)) {
        local_2c = (float)(iVar1 + iVar2);
      }
    }
  }
  Abc_BufSetNodeDep(p,pObj,(int)local_2c);
  return local_2c;
}

Assistant:

float Abc_BufComputeDep( Buf_Man_t * p, Abc_Obj_t * pObj )
{
    Abc_Obj_t * pFanout;
    int i;
    float DelayF, Delay = -ABC_INFINITY;
    Abc_ObjForEachFanout( pObj, pFanout, i )
    {
        if ( Vec_IntEntry(p->vOffsets, Abc_ObjId(pFanout)) == -ABC_INFINITY )
            continue;
        DelayF = Abc_BufNodeDep(p, pFanout) + Abc_BufEdgeDelay(p, pFanout, Abc_NodeFindFanin(pFanout, pObj));
        if ( Delay < DelayF )
            Delay = DelayF;
    }
    Abc_BufSetNodeDep( p, pObj, Delay );
    return Delay;
}